

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiletime_evaluation.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  ct_constant<7L> c7;
  ct_constant<5L> c5;
  ct_variable<2UL> z;
  ct_variable<1UL> y;
  ct_variable<0UL> x;
  ct_constant<7L> local_35;
  ct_constant<5L> local_34;
  ct_variable<2UL> local_33;
  ct_variable<1UL> local_32;
  ct_variable<0UL> local_31;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<7L>_>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
  local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Involved types ---",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x: ",3);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_31);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"y: ",3);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_32);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"z: ",3);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_33);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c5: ",4);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_34);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"c7: ",4);
  poVar1 = viennamath::operator<<((ostream *)&std::cout,&local_35);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--- Various expressions: ---",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  operations_test<viennamath::ct_variable<0ul>>(&local_31);
  operations_test<viennamath::ct_constant<5l>>(&local_34);
  operations_test<viennamath::ct_constant<7l>>(&local_35);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>>
            ((ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
              *)&local_30);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_mult<double>,viennamath::ct_variable<1ul>>>
            ((ct_binary_expr<viennamath::ct_variable<2UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
              *)&local_30);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_constant<5l>,viennamath::op_div<double>,viennamath::ct_variable<0ul>>>
            ((ct_binary_expr<viennamath::ct_constant<5L>,_viennamath::op_div<double>,_viennamath::ct_variable<0UL>_>
              *)&local_30);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_constant<7l>,viennamath::op_minus<double>,viennamath::ct_variable<2ul>>>
            ((ct_binary_expr<viennamath::ct_constant<7L>,_viennamath::op_minus<double>,_viennamath::ct_variable<2UL>_>
              *)&local_30);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_variable<2ul>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>
            ((ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_plus<double>,_viennamath::ct_constant<5L>_>,_viennamath::op_div<double>,_viennamath::ct_constant<7L>_>,_viennamath::op_minus<double>,_viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_div<double>,_viennamath::ct_variable<2UL>_>,_viennamath::op_plus<double>,_viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_constant<5L>_>_>_>
              *)&local_30);
  operations_test<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_plus<double>,viennamath::ct_constant<5l>>,viennamath::op_div<double>,viennamath::ct_constant<7l>>,viennamath::op_minus<double>,viennamath::ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<1ul>,viennamath::op_div<double>,viennamath::ct_binary_expr<viennamath::ct_variable<2ul>,viennamath::op_plus<double>,viennamath::ct_constant<7l>>>,viennamath::op_plus<double>,viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_constant<5l>>>>>
            (&local_30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*****     TEST COMPLETED SUCCESSFULLY!     *****",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"************************************************",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
  viennamath::ct_variable<0> x;
  viennamath::ct_variable<1> y;
  viennamath::ct_variable<2> z;
  viennamath::ct_constant<5> c5;
  viennamath::ct_constant<7> c7;


  std::cout << "--- Involved types ---" << std::endl;
  std::cout << "x: " << x << std::endl;
  std::cout << "y: " << y << std::endl;
  std::cout << "z: " << z << std::endl;
  std::cout << "c5: " << c5 << std::endl;
  std::cout << "c7: " << c7 << std::endl;

  std::cout << "--- Various expressions: ---" << std::endl;
  operations_test(x);
  operations_test(c5);
  operations_test(c7);
  operations_test(x + y);
  operations_test(z * y);
  operations_test(c5 / x);
  operations_test(c7 - z);


  //complicated beast:
  // (4 + 5) / 7 - (6 / 8 + 4 * 5)
  // = 9 / 7 - (20 + 6 / 8)
  // = 9 / 7 - 166 / 8
  // = (9*8 - 166 * 7) / 56
  // = (72 -  1162) / 56
  operations_test( (x + c5) / c7 - (y / z + x * c5) );

  operations_test( (x + c5) / c7 - (y / (z + c7) + x * c5) );

  std::cout << "************************************************" << std::endl;
  std::cout << "*****     TEST COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "************************************************" << std::endl;

  return EXIT_SUCCESS;
}